

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::ResolveTargetsInGeneratorExpression
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  cmLocalGenerator *this_00;
  char *pcVar8;
  char cVar9;
  ulong uVar10;
  string errorString;
  string targetName_1;
  string local_88;
  cmGeneratorTarget *local_68;
  cmExportFileGenerator *local_60;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68 = target;
  local_60 = this;
  local_38 = missingTargets;
  lVar3 = std::__cxx11::string::find((char *)input,0x4fde44,0);
  cVar9 = (char)input;
  while (lVar3 != -1) {
    uVar10 = lVar3 + 0x12;
    uVar4 = std::__cxx11::string::find(cVar9,0x3e);
    uVar5 = std::__cxx11::string::find(cVar9,0x2c);
    uVar6 = std::__cxx11::string::find((char *)input,0x4e99ab,uVar10);
    if ((((uVar5 <= uVar6) && (uVar5 <= uVar4)) && (uVar4 != 0xffffffffffffffff)) &&
       (uVar5 != 0xffffffffffffffff)) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)input);
      bVar2 = AddTargetNamespace(local_60,&local_88,local_68,local_38);
      if (bVar2) {
        std::__cxx11::string::replace
                  ((ulong)input,uVar10,(char *)(uVar5 - uVar10),(ulong)local_88._M_dataplus._M_p);
      }
      sVar1 = local_88._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      uVar10 = sVar1 + lVar3 + 0x13;
    }
    lVar3 = std::__cxx11::string::find((char *)input,0x4fde44,uVar10);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  uVar10 = 0;
  do {
    uVar4 = std::__cxx11::string::find((char *)input,0x4e9f06,uVar10);
    if (uVar4 == 0xffffffffffffffff) break;
    uVar5 = std::__cxx11::string::find(cVar9,0x3e);
    if (uVar5 == 0xffffffffffffffff) {
      bVar2 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&local_88,0,(char *)local_88._M_string_length,0x4fde57);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)input);
      lVar3 = std::__cxx11::string::find((char *)&local_58,0x4e99ab,0);
      pcVar8 = "$<TARGET_NAME:...> requires its parameter to be a literal.";
      if (lVar3 == -1) {
        bVar2 = AddTargetNamespace(local_60,&local_58,local_68,local_38);
        pcVar8 = "$<TARGET_NAME:...> requires its parameter to be a reachable target.";
        if (!bVar2) goto LAB_002ea870;
        std::__cxx11::string::replace
                  ((ulong)input,uVar4,(char *)((uVar5 - uVar4) + 1),(ulong)local_58._M_dataplus._M_p
                  );
        bVar2 = true;
        uVar10 = uVar5;
      }
      else {
LAB_002ea870:
        bVar2 = false;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_88,0,(char *)local_88._M_string_length,(ulong)pcVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  } while (bVar2);
  uVar10 = 0;
  do {
    if (((char *)local_88._M_string_length != (char *)0x0) ||
       (lVar3 = std::__cxx11::string::find((char *)input,0x4f7798,uVar10), lVar3 == -1)) break;
    lVar7 = std::__cxx11::string::find(cVar9,0x3e);
    if (lVar7 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_88,0,(char *)local_88._M_string_length,0x4fdeff);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)input);
      bVar2 = cmGeneratorExpression::IsValidTargetName(&local_58);
      if ((bVar2) && (bVar2 = AddTargetNamespace(local_60,&local_58,local_68,local_38), bVar2)) {
        std::__cxx11::string::replace
                  ((ulong)input,lVar3 + 0xcU,(char *)(lVar7 - (lVar3 + 0xcU)),
                   (ulong)local_58._M_dataplus._M_p);
      }
      sVar1 = local_58._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar10 = lVar3 + sVar1 + 0xd;
    }
  } while (lVar7 != -1);
  (*local_60->_vptr_cmExportFileGenerator[0x11])(local_60,input);
  if ((char *)local_88._M_string_length != (char *)0x0) {
    this_00 = cmGeneratorTarget::GetLocalGenerator(local_68);
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::ResolveTargetsInGeneratorExpression(
  std::string& input, cmGeneratorTarget* target,
  std::vector<std::string>& missingTargets)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  while ((pos = input.find("$<TARGET_PROPERTY:", lastPos)) !=
         std::string::npos) {
    std::string::size_type nameStartPos =
      pos + sizeof("$<TARGET_PROPERTY:") - 1;
    std::string::size_type closePos = input.find('>', nameStartPos);
    std::string::size_type commaPos = input.find(',', nameStartPos);
    std::string::size_type nextOpenPos = input.find("$<", nameStartPos);
    if (commaPos == std::string::npos    // Implied 'this' target
        || closePos == std::string::npos // Incomplete expression.
        || closePos < commaPos           // Implied 'this' target
        || nextOpenPos < commaPos)       // Non-literal
    {
      lastPos = nameStartPos;
      continue;
    }

    std::string targetName =
      input.substr(nameStartPos, commaPos - nameStartPos);

    if (this->AddTargetNamespace(targetName, target, missingTargets)) {
      input.replace(nameStartPos, commaPos - nameStartPos, targetName);
    }
    lastPos = nameStartPos + targetName.size() + 1;
  }

  std::string errorString;
  pos = 0;
  lastPos = pos;
  while ((pos = input.find("$<TARGET_NAME:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + sizeof("$<TARGET_NAME:") - 1;
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<TARGET_NAME:...> expression incomplete";
      break;
    }
    std::string targetName = input.substr(nameStartPos, endPos - nameStartPos);
    if (targetName.find("$<") != std::string::npos) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "literal.";
      break;
    }
    if (!this->AddTargetNamespace(targetName, target, missingTargets)) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "reachable target.";
      break;
    }
    input.replace(pos, endPos - pos + 1, targetName);
    lastPos = endPos;
  }

  pos = 0;
  lastPos = pos;
  while (errorString.empty() &&
         (pos = input.find("$<LINK_ONLY:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + sizeof("$<LINK_ONLY:") - 1;
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<LINK_ONLY:...> expression incomplete";
      break;
    }
    std::string libName = input.substr(nameStartPos, endPos - nameStartPos);
    if (cmGeneratorExpression::IsValidTargetName(libName) &&
        this->AddTargetNamespace(libName, target, missingTargets)) {
      input.replace(nameStartPos, endPos - nameStartPos, libName);
    }
    lastPos = nameStartPos + libName.size() + 1;
  }

  this->ReplaceInstallPrefix(input);

  if (!errorString.empty()) {
    target->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                              errorString);
  }
}